

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_distributed_random_value_generation.cc
# Opt level: O1

bool __thiscall
sptk::NormalDistributedRandomValueGeneration::Get
          (NormalDistributedRandomValueGeneration *this,double *output)

{
  uint64_t uVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  if (output != (double *)0x0) {
    if (this->switch_ == true) {
      this->switch_ = false;
      uVar1 = this->next_;
      do {
        do {
          lVar2 = uVar1 * 0x41c64e6d + 0x3039;
          uVar1 = lVar2 * 0x41c64e6d + 0x3039;
          auVar7._0_4_ = (undefined4)((ulong)lVar2 >> 0x10);
          auVar7._8_4_ = (undefined4)(uVar1 >> 0x10);
          auVar7._4_4_ = auVar7._8_4_;
          auVar7._12_2_ = (short)(uVar1 >> 0x30);
          auVar7._14_2_ = 0;
          auVar6._0_8_ = (double)SUB164(auVar7 & _DAT_00111930,0);
          auVar6._8_8_ = (double)SUB164(auVar7 & _DAT_00111930,4);
          auVar7 = divpd(auVar6,_DAT_00111940);
          dVar5 = auVar7._0_8_ + auVar7._0_8_ + -1.0;
          dVar8 = auVar7._8_8_ + auVar7._8_8_ + -1.0;
          dVar4 = dVar5 * dVar5 + dVar8 * dVar8;
        } while (dVar4 == 0.0);
      } while (1.0 <= dVar4);
      this->next_ = uVar1;
      this->r1_ = dVar5;
      this->r2_ = dVar8;
      this->s_ = dVar4;
      dVar4 = log(dVar4);
      dVar4 = (dVar4 * -2.0) / this->s_;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      this->s_ = dVar4;
      pdVar3 = &this->r1_;
    }
    else {
      this->switch_ = true;
      dVar4 = this->r2_;
      pdVar3 = &this->s_;
    }
    *output = dVar4 * *pdVar3;
  }
  return output != (double *)0x0;
}

Assistant:

bool NormalDistributedRandomValueGeneration::Get(double* output) {
  if (NULL == output) {
    return false;
  }

  if (switch_) {
    switch_ = false;
    do {
      r1_ = 2.0 * PseudoRandomGeneration(&(next_)) - 1.0;
      r2_ = 2.0 * PseudoRandomGeneration(&(next_)) - 1.0;
      s_ = r1_ * r1_ + r2_ * r2_;
    } while (0.0 == s_ || 1.0 <= s_);
    s_ = std::sqrt(-2.0 * std::log(s_) / s_);
    *output = r1_ * s_;
  } else {
    switch_ = true;
    *output = r2_ * s_;
  }

  return true;
}